

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwizard.cpp
# Opt level: O2

void QWizardPage::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  qsizetype qVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  byte bVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      lVar3 = *(long *)(_o + 8);
      bVar6 = (**(code **)(**(long **)(lVar3 + 8) + 0x1b8))();
      *(uint *)(lVar3 + 0x308) = (uint)bVar6;
    }
    else {
      if (_id == 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QWizardPagePrivate::_q_maybeEmitCompleteChanged(*(QWizardPagePrivate **)(_o + 8));
          return;
        }
        goto LAB_004c5b9a;
      }
      if (_id == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          completeChanged((QWizardPage *)_o);
          return;
        }
        goto LAB_004c5b9a;
      }
    }
    break;
  case ReadProperty:
    puVar1 = (undefined8 *)*_a;
    if (_id == 1) {
      subTitle((QString *)&local_38,(QWizardPage *)_o);
    }
    else {
      if (_id != 0) break;
      title((QString *)&local_38,(QWizardPage *)_o);
    }
    pDVar4 = (Data *)*puVar1;
    pcVar5 = (char16_t *)puVar1[1];
    *puVar1 = local_38.d;
    puVar1[1] = local_38.ptr;
    qVar2 = puVar1[2];
    puVar1[2] = local_38.size;
    local_38.d = pDVar4;
    local_38.ptr = pcVar5;
    local_38.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    break;
  case WriteProperty:
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setSubTitle((QWizardPage *)_o,(QString *)*_a);
        return;
      }
      goto LAB_004c5b9a;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setTitle((QWizardPage *)_o,(QString *)*_a);
        return;
      }
      goto LAB_004c5b9a;
    }
    break;
  case IndexOfMethod:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QtMocHelpers::indexOfMethod<void(QWizardPage::*)()>
                ((QtMocHelpers *)_a,(void **)completeChanged,0,0);
      return;
    }
    goto LAB_004c5b9a;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_004c5b9a:
  __stack_chk_fail();
}

Assistant:

void QWizardPage::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWizardPage *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->completeChanged(); break;
        case 1: _t->d_func()->_q_maybeEmitCompleteChanged(); break;
        case 2: _t->d_func()->_q_updateCachedCompleteState(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWizardPage::*)()>(_a, &QWizardPage::completeChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->subTitle(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setSubTitle(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}